

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::FreeWallyBuffer(void *source)

{
  CfdException *this;
  allocator local_8d;
  int ret;
  undefined1 local_88 [32];
  wally_operations local_68;
  
  local_68.reserved_2 = (void *)0x0;
  local_68.reserved_3 = (void *)0x0;
  local_68.secp_context_fn = (secp_context_t)0x0;
  local_68.reserved_1 = (void *)0x0;
  local_68.bzero_fn = (wally_bzero_t)0x0;
  local_68.ec_nonce_fn = (wally_ec_nonce_t)0x0;
  local_68.malloc_fn = (wally_malloc_t)0x0;
  local_68.free_fn = (wally_free_t)0x0;
  local_68.reserved_4 = (void *)0x0;
  local_68.struct_size = 0x50;
  ret = wally_get_operations(&local_68);
  if (ret == 0) {
    (*local_68.free_fn)(source);
    return;
  }
  local_88._0_8_ = "cfdcore_psbt.cpp";
  local_88._8_4_ = 0x1b3;
  local_88._16_8_ = "FreeWallyBuffer";
  logger::warn<int&>((CfdSourceLocation *)local_88,"wally_get_operations NG[{}]",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_88,"OperationFunctions get error.",&local_8d);
  CfdException::CfdException(this,kCfdInternalError,(string *)local_88);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void FreeWallyBuffer(void *source) {
  wally_free_t free_func = nullptr;

  int ret;
  if (free_func == nullptr) {
    struct wally_operations ops;
    memset(&ops, 0, sizeof(ops));
    ops.struct_size = sizeof(ops);
    ret = wally_get_operations(&ops);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_get_operations NG[{}]", ret);
      throw CfdException(kCfdInternalError, "OperationFunctions get error.");
    }
    free_func = ops.free_fn;
  }
  free_func(source);
}